

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O3

void * Abc_NtkMiterSatCreate(Abc_Ntk_t *pNtk,int fAllPrimes)

{
  byte *pbVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  sat_solver *psVar3;
  Mem_Flex_t *pMmMan;
  Vec_Str_t *vCube;
  char *pcVar4;
  Vec_Int_t *vVars;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  char *pSop1;
  char *pSop0;
  char *local_40;
  char *local_38;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    nMuxes = 0;
    psVar3 = sat_solver_new();
    iVar2 = Abc_NtkMiterSatCreateInt(psVar3,pNtk);
    sat_solver_store_mark_roots(psVar3);
    pVVar6 = pNtk->vObjs;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        if (pVVar6->pArray[lVar7] != (void *)0x0) {
          pbVar1 = (byte *)((long)pVVar6->pArray[lVar7] + 0x14);
          *pbVar1 = *pbVar1 & 0xef;
          pVVar6 = pNtk->vObjs;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
    if (iVar2 != 0) {
      return psVar3;
    }
    sat_solver_delete(psVar3);
    return (void *)0x0;
  }
  if ((pNtk->ntkType != ABC_NTK_LOGIC) || (pNtk->ntkFunc != ABC_FUNC_BDD)) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                  ,0x27e,"void *Abc_NtkMiterSatCreate(Abc_Ntk_t *, int)");
  }
  pVVar6 = pNtk->vPis;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      *(long *)((long)pVVar6->pArray[lVar7] + 0x40) =
           (long)*(int *)((long)pVVar6->pArray[lVar7] + 0x10);
      lVar7 = lVar7 + 1;
      pVVar6 = pNtk->vPis;
    } while (lVar7 < pVVar6->nSize);
  }
  psVar3 = sat_solver_new();
  sat_solver_store_alloc(psVar3);
  pMmMan = Mem_FlexStart();
  vCube = (Vec_Str_t *)malloc(0x10);
  vCube->nCap = 100;
  vCube->nSize = 0;
  pcVar4 = (char *)malloc(100);
  vCube->pArray = pcVar4;
  vVars = (Vec_Int_t *)malloc(0x10);
  vVars->nCap = 100;
  vVars->nSize = 0;
  piVar5 = (int *)malloc(400);
  vVars->pArray = piVar5;
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar6->pArray[lVar7];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NodeBddToCnf(pNode,pMmMan,vCube,fAllPrimes,&local_38,&local_40);
        iVar2 = Abc_NodeAddClauses(psVar3,local_38,local_40,pNode,vVars);
        if (iVar2 == 0) goto LAB_002a04ff;
        pVVar6 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vPos;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      iVar2 = Abc_NodeAddClausesTop(psVar3,(Abc_Obj_t *)pVVar6->pArray[lVar7],vVars);
      if (iVar2 == 0) goto LAB_002a04ff;
      lVar7 = lVar7 + 1;
      pVVar6 = pNtk->vPos;
    } while (lVar7 < pVVar6->nSize);
  }
  sat_solver_store_mark_roots(psVar3);
LAB_002a0509:
  if (vCube->pArray != (char *)0x0) {
    free(vCube->pArray);
  }
  free(vCube);
  if (vVars->pArray != (int *)0x0) {
    free(vVars->pArray);
  }
  free(vVars);
  Mem_FlexStop(pMmMan,0);
  return psVar3;
LAB_002a04ff:
  sat_solver_delete(psVar3);
  psVar3 = (sat_solver *)0x0;
  goto LAB_002a0509;
}

Assistant:

void * Abc_NtkMiterSatCreate( Abc_Ntk_t * pNtk, int fAllPrimes )
{
    sat_solver * pSat;
    Abc_Obj_t * pNode;
    int RetValue, i; //, clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk) );
    if ( Abc_NtkIsBddLogic(pNtk) )
        return Abc_NtkMiterSatCreateLogic(pNtk, fAllPrimes);

    nMuxes = 0;
    pSat = sat_solver_new();
//sat_solver_store_alloc( pSat );
    RetValue = Abc_NtkMiterSatCreateInt( pSat, pNtk );
sat_solver_store_mark_roots( pSat );

    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->fMarkA = 0;
//    ASat_SolverWriteDimacs( pSat, "temp_sat.cnf", NULL, NULL, 1 );
    if ( RetValue == 0 )
    {
        sat_solver_delete(pSat);
        return NULL;
    }
//    printf( "Ands = %6d.  Muxes = %6d (%5.2f %%).  ", Abc_NtkNodeNum(pNtk), nMuxes, 300.0*nMuxes/Abc_NtkNodeNum(pNtk) );
//    ABC_PRT( "Creating sat_solver", Abc_Clock() - clk );
    return pSat;
}